

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrConditionalWrapper.cpp
# Opt level: O1

Statement * __thiscall
IRT::OrConditionalWrapper::ToConditional
          (OrConditionalWrapper *this,Label *true_label,Label *false_label)

{
  SubtreeWrapper *pSVar1;
  pointer pcVar2;
  SeqStatement *this_00;
  SeqStatement *this_01;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  undefined4 extraout_var_00;
  long *local_110 [2];
  long local_100 [2];
  undefined1 local_f0 [8];
  Label middle_label;
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  Label local_90;
  long *local_70 [2];
  long local_60 [2];
  SeqStatement *local_50;
  SeqStatement *local_48;
  LabelStatement *local_40;
  undefined4 local_34;
  
  Label::Label((Label *)local_f0);
  local_50 = (SeqStatement *)operator_new(0x18);
  pSVar1 = this->first_;
  middle_label.label_.field_2._8_8_ = local_c0;
  pcVar2 = (true_label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&middle_label.label_.field_2 + 8),pcVar2,
             pcVar2 + (true_label->label_)._M_string_length);
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,local_f0,middle_label.label_._M_dataplus._M_p + (long)local_f0);
  iVar3 = (*pSVar1->_vptr_SubtreeWrapper[4])
                    (pSVar1,(undefined1 *)((long)&middle_label.label_.field_2 + 8),local_b0);
  local_48 = (SeqStatement *)operator_new(0x18);
  local_40 = (LabelStatement *)operator_new(0x28);
  local_90.label_._M_dataplus._M_p = (pointer)&local_90.label_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_f0,middle_label.label_._M_dataplus._M_p + (long)local_f0);
  local_34 = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  LabelStatement::LabelStatement(local_40,&local_90);
  pSVar1 = this->second_;
  local_70[0] = local_60;
  pcVar2 = (true_label->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (true_label->label_)._M_string_length);
  pcVar2 = (false_label->label_)._M_dataplus._M_p;
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_110,pcVar2,pcVar2 + (false_label->label_)._M_string_length);
  this_01 = local_48;
  this_00 = local_50;
  iVar4 = (*pSVar1->_vptr_SubtreeWrapper[4])(pSVar1,local_70,local_110);
  SeqStatement::SeqStatement
            (this_01,&local_40->super_Statement,(Statement *)CONCAT44(extraout_var_00,iVar4));
  SeqStatement::SeqStatement
            (this_00,(Statement *)CONCAT44(extraout_var,iVar3),&this_01->super_Statement);
  if (local_110[0] != local_100) {
    operator_delete(local_110[0],local_100[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.label_._M_dataplus._M_p != &local_90.label_.field_2) {
    operator_delete(local_90.label_._M_dataplus._M_p,
                    local_90.label_.field_2._M_allocated_capacity + 1);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if ((long *)middle_label.label_.field_2._8_8_ != local_c0) {
    operator_delete((void *)middle_label.label_.field_2._8_8_,local_c0[0] + 1);
  }
  if (local_f0 != (undefined1  [8])&middle_label.label_._M_string_length) {
    operator_delete((void *)local_f0,middle_label.label_._M_string_length + 1);
  }
  return &this_00->super_Statement;
}

Assistant:

Statement *OrConditionalWrapper::ToConditional(Label true_label, Label false_label) {
    Label middle_label;
    return new SeqStatement(
        first_->ToConditional(true_label, middle_label),
        new SeqStatement(
            new LabelStatement(middle_label),
            second_->ToConditional(true_label, false_label)
        )
    );
}